

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_builder.cc
# Opt level: O1

void __thiscall
leveldb::TableBuilder::WriteRawBlock
          (TableBuilder *this,Slice *block_contents,CompressionType type,BlockHandle *handle)

{
  Rep *pRVar1;
  uint32_t uVar2;
  char *pcVar3;
  char trailer [5];
  char *local_40;
  char local_35;
  char local_34 [4];
  char *local_30;
  undefined8 local_28;
  
  pRVar1 = this->rep_;
  handle->offset_ = pRVar1->offset;
  handle->size_ = block_contents->size_;
  (*pRVar1->file->_vptr_WritableFile[2])(&local_30,pRVar1->file,block_contents);
  pcVar3 = (pRVar1->status).state_;
  if (pcVar3 != local_30) {
    if (pcVar3 != (char *)0x0) {
      operator_delete__(pcVar3);
    }
    if (local_30 == (char *)0x0) {
      pcVar3 = (char *)0x0;
    }
    else {
      pcVar3 = Status::CopyState(local_30);
    }
    (pRVar1->status).state_ = pcVar3;
  }
  if (local_30 != (char *)0x0) {
    operator_delete__(local_30);
  }
  if ((pRVar1->status).state_ == (char *)0x0) {
    local_35 = (char)type;
    uVar2 = crc32c::Extend(0,block_contents->data_,block_contents->size_);
    uVar2 = crc32c::Extend(uVar2,&local_35,1);
    EncodeFixed32(local_34,(uVar2 << 0x11 | uVar2 >> 0xf) + 0xa282ead8);
    local_28 = 5;
    local_30 = &local_35;
    (*pRVar1->file->_vptr_WritableFile[2])(&local_40);
    pcVar3 = (pRVar1->status).state_;
    if (pcVar3 != local_40) {
      if (pcVar3 != (char *)0x0) {
        operator_delete__(pcVar3);
      }
      if (local_40 == (char *)0x0) {
        pcVar3 = (char *)0x0;
      }
      else {
        pcVar3 = Status::CopyState(local_40);
      }
      (pRVar1->status).state_ = pcVar3;
    }
    if (local_40 != (char *)0x0) {
      operator_delete__(local_40);
    }
    if ((pRVar1->status).state_ == (char *)0x0) {
      pRVar1->offset = block_contents->size_ + pRVar1->offset + 5;
    }
  }
  return;
}

Assistant:

void TableBuilder::WriteRawBlock(const Slice &block_contents,
                                     CompressionType type,
                                     BlockHandle *handle) {
        Rep *r = rep_;
        handle->set_offset(r->offset);
        handle->set_size(block_contents.size());
        r->status = r->file->Append(block_contents);
        if (r->status.ok()) {
            char trailer[kBlockTrailerSize];
            trailer[0] = type;
            uint32_t crc = crc32c::Value(block_contents.data(), block_contents.size());
            crc = crc32c::Extend(crc, trailer, 1);  // Extend crc to cover block type
            EncodeFixed32(trailer + 1, crc32c::Mask(crc));
            r->status = r->file->Append(Slice(trailer, kBlockTrailerSize));
            if (r->status.ok()) {
                r->offset += block_contents.size() + kBlockTrailerSize;
            }
        }
    }